

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::DtlsTest_MbedtlsClientServer_Test::TestBody
          (DtlsTest_MbedtlsClientServer_Test *this)

{
  allocator<unsigned_char> *this_00;
  initializer_list<unsigned_char> __l;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  char *pcVar3;
  element_type *peVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  AssertHelper local_1ce0;
  Message local_1cd8;
  int local_1ccc;
  undefined1 local_1cc8 [8];
  AssertionResult gtest_ar_5;
  undefined1 local_1cb0 [4];
  int fail;
  anon_class_8_1_5be0a465 local_1c90;
  anon_class_8_1_5be0a465 clientConnected;
  Message local_1c80;
  ErrorCode local_1c74;
  Error local_1c70;
  undefined1 local_1c48 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_1c28 [8];
  DtlsSession dtlsClient;
  Message local_fd0;
  int local_fc8;
  allocator local_fc1;
  string local_fc0;
  int local_f9c;
  undefined1 local_f98 [8];
  AssertionResult gtest_ar_3;
  shared_ptr<ot::commissioner::UdpSocket> clientSocket;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f60;
  allocator<unsigned_char> local_f41;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f30;
  allocator<unsigned_char> local_f11;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f08;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f00;
  ConnectHandler local_ee8;
  anon_class_1_0_00000001 local_ec1;
  undefined1 auStack_ec0 [7];
  anon_class_1_0_00000001 serverConnected;
  Receiver local_eb0;
  AssertHelper local_e90;
  Message local_e88;
  ErrorCode local_e7c;
  Error local_e78;
  undefined1 local_e50 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_e30 [8];
  DtlsSession dtlsServer;
  Message local_1d8;
  int local_1d0;
  allocator local_1c9;
  string local_1c8;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  shared_ptr<ot::commissioner::UdpSocket> serverSocket;
  AssertHelper local_178;
  Message local_170;
  void *local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  event_base *eventBase;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  allocator<unsigned_char> local_111;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  allocator<unsigned_char> local_e1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  undefined1 local_b8 [8];
  DtlsConfig config;
  allocator<unsigned_char> local_3e;
  uchar local_3d [5];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  ByteArray kHello;
  DtlsTest_MbedtlsClientServer_Test *this_local;
  
  builtin_memcpy(local_3d,"hello",5);
  local_38 = local_3d;
  local_30 = 5;
  kHello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_3e);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,__l,&local_3e);
  std::allocator<unsigned_char>::~allocator(&local_3e);
  DtlsConfig::DtlsConfig((DtlsConfig *)local_b8);
  local_d8._M_current = (char *)std::__cxx11::string::begin();
  local_e0._M_current = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator(&local_e1);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_d0,local_d8,local_e0,
             &local_e1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &config.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_d0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_d0);
  std::allocator<unsigned_char>::~allocator(&local_e1);
  local_108._M_current = (char *)std::__cxx11::string::begin();
  local_110._M_current = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator(&local_111);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_100,local_108,local_110,
             &local_111);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &config.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_100);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_100);
  std::allocator<unsigned_char>::~allocator(&local_111);
  local_138._M_current = (char *)std::__cxx11::string::begin();
  local_140._M_current = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&eventBase + 7));
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_130,local_138,local_140,
             (allocator<unsigned_char> *)((long)&eventBase + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &config.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_130);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_130);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&eventBase + 7));
  eventBase._6_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &config.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (value_type_conflict *)((long)&eventBase + 6));
  eventBase._5_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &config.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (value_type_conflict *)((long)&eventBase + 5));
  eventBase._4_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &config.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (value_type_conflict *)((long)&eventBase + 4));
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )event_base_new();
  local_168 = (void *)0x0;
  testing::internal::CmpHelperNE<event_base*,decltype(nullptr)>
            ((internal *)local_160,"eventBase","nullptr",(event_base **)&gtest_ar.message_,
             &local_168);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar2) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
               ,0x7d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  if (bVar2) {
    std::make_shared<ot::commissioner::UdpSocket,event_base*&>((event_base **)&gtest_ar_1.message_);
    peVar4 = std::
             __shared_ptr_access<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&gtest_ar_1.message_);
    pcVar3 = kServerAddr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,pcVar3,&local_1c9);
    local_1a4 = UdpSocket::Bind(peVar4,&local_1c8,0x1633);
    local_1d0 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1a0,"serverSocket->Bind(kServerAddr, kServerPort)","0",&local_1a4,
               &local_1d0);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar2) {
      testing::Message::Message(&local_1d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&dtlsServer.mOwnKey.priv_id,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0x80,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&dtlsServer.mOwnKey.priv_id,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&dtlsServer.mOwnKey.priv_id);
      testing::Message::~Message(&local_1d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    uVar1 = gtest_ar.message_;
    std::shared_ptr<ot::commissioner::Socket>::shared_ptr<ot::commissioner::UdpSocket,void>
              ((shared_ptr<ot::commissioner::Socket> *)&gtest_ar_2.message_,
               (shared_ptr<ot::commissioner::UdpSocket> *)&gtest_ar_1.message_);
    DtlsSession::DtlsSession
              ((DtlsSession *)local_e30,
               (event_base *)
               uVar1._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,true,(SocketPtr *)&gtest_ar_2.message_);
    std::shared_ptr<ot::commissioner::Socket>::~shared_ptr
              ((shared_ptr<ot::commissioner::Socket> *)&gtest_ar_2.message_);
    DtlsSession::Init(&local_e78,(DtlsSession *)local_e30,(DtlsConfig *)local_b8);
    local_e7c = kNone;
    testing::internal::EqHelper::
    Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
              ((EqHelper *)local_e50,"dtlsServer.Init(config)","ErrorCode::kNone",&local_e78,
               &local_e7c);
    Error::~Error(&local_e78);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e50);
    if (!bVar2) {
      testing::Message::Message(&local_e88);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e50);
      testing::internal::AssertHelper::AssertHelper
                (&local_e90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0x83,pcVar3);
      testing::internal::AssertHelper::operator=(&local_e90,&local_e88);
      testing::internal::AssertHelper::~AssertHelper(&local_e90);
      testing::Message::~Message(&local_e88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e50);
    _auStack_ec0 = (ByteArray *)local_28;
    std::
    function<void(ot::commissioner::Endpoint&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
    ::function<ot::commissioner::DtlsTest_MbedtlsClientServer_Test::TestBody()::__0,void>
              ((function<void(ot::commissioner::Endpoint&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                *)&local_eb0,(anon_class_16_2_dec9154f *)auStack_ec0);
    Endpoint::SetReceiver((Endpoint *)local_e30,&local_eb0);
    std::
    function<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::~function(&local_eb0);
    std::function<void(ot::commissioner::DtlsSession&,ot::commissioner::Error)>::
    function<ot::commissioner::DtlsTest_MbedtlsClientServer_Test::TestBody()::__1&,void>
              ((function<void(ot::commissioner::DtlsSession&,ot::commissioner::Error)> *)&local_ee8,
               &local_ec1);
    DtlsSession::Connect((DtlsSession *)local_e30,&local_ee8);
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::~function
              (&local_ee8);
    local_f08._M_current = (char *)std::__cxx11::string::begin();
    local_f10._M_current = (char *)std::__cxx11::string::end();
    std::allocator<unsigned_char>::allocator(&local_f11);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f00,local_f08,local_f10
               ,&local_f11);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &config.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_f00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_f00);
    std::allocator<unsigned_char>::~allocator(&local_f11);
    local_f38._M_current = (char *)std::__cxx11::string::begin();
    local_f40._M_current = (char *)std::__cxx11::string::end();
    std::allocator<unsigned_char>::allocator(&local_f41);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f30,local_f38,local_f40
               ,&local_f41);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &config.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_f30);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_f30);
    std::allocator<unsigned_char>::~allocator(&local_f41);
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    this_00 = (allocator<unsigned_char> *)
              ((long)&clientSocket.
                      super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7);
    std::allocator<unsigned_char>::allocator(this_00);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f60,__first,__last,
               this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &config.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_f60);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_f60);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&clientSocket.
                       super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    clientSocket.super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._6_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &config.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type_conflict *)
               ((long)&clientSocket.
                       super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 6));
    clientSocket.super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._5_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &config.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type_conflict *)
               ((long)&clientSocket.
                       super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 5));
    clientSocket.super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &config.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type_conflict *)
               ((long)&clientSocket.
                       super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 4));
    std::make_shared<ot::commissioner::UdpSocket,event_base*&>((event_base **)&gtest_ar_3.message_);
    peVar4 = std::
             __shared_ptr_access<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&gtest_ar_3.message_);
    pcVar3 = kServerAddr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_fc0,pcVar3,&local_fc1);
    local_f9c = UdpSocket::Connect(peVar4,&local_fc0,0x1633);
    local_fc8 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_f98,"clientSocket->Connect(kServerAddr, kServerPort)","0",
               &local_f9c,&local_fc8);
    std::__cxx11::string::~string((string *)&local_fc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_fc1);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f98);
    if (!bVar2) {
      testing::Message::Message(&local_fd0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f98);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&dtlsClient.mOwnKey.priv_id,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0x9b,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&dtlsClient.mOwnKey.priv_id,&local_fd0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&dtlsClient.mOwnKey.priv_id);
      testing::Message::~Message(&local_fd0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f98);
    uVar1 = gtest_ar.message_;
    std::shared_ptr<ot::commissioner::Socket>::shared_ptr<ot::commissioner::UdpSocket,void>
              ((shared_ptr<ot::commissioner::Socket> *)&gtest_ar_4.message_,
               (shared_ptr<ot::commissioner::UdpSocket> *)&gtest_ar_3.message_);
    DtlsSession::DtlsSession
              ((DtlsSession *)local_1c28,
               (event_base *)
               uVar1._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,false,(SocketPtr *)&gtest_ar_4.message_);
    std::shared_ptr<ot::commissioner::Socket>::~shared_ptr
              ((shared_ptr<ot::commissioner::Socket> *)&gtest_ar_4.message_);
    DtlsSession::Init(&local_1c70,(DtlsSession *)local_1c28,(DtlsConfig *)local_b8);
    local_1c74 = kNone;
    testing::internal::EqHelper::
    Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
              ((EqHelper *)local_1c48,"dtlsClient.Init(config)","ErrorCode::kNone",&local_1c70,
               &local_1c74);
    Error::~Error(&local_1c70);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c48);
    if (!bVar2) {
      testing::Message::Message(&local_1c80);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c48);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&clientConnected,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0x9e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&clientConnected,&local_1c80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&clientConnected);
      testing::Message::~Message(&local_1c80);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c48);
    local_1c90.kHello = (ByteArray *)local_28;
    std::function<void(ot::commissioner::DtlsSession&,ot::commissioner::Error)>::
    function<ot::commissioner::DtlsTest_MbedtlsClientServer_Test::TestBody()::__2&,void>
              ((function<void(ot::commissioner::DtlsSession&,ot::commissioner::Error)> *)local_1cb0,
               &local_1c90);
    DtlsSession::Connect((DtlsSession *)local_1c28,(ConnectHandler *)local_1cb0);
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::~function
              ((function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)> *)
               local_1cb0);
    gtest_ar_5.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ =
         event_base_loop((event_base *)
                         gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,4);
    local_1ccc = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1cc8,"fail","0",
               (int *)((long)&gtest_ar_5.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 4),&local_1ccc);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1cc8);
    if (!bVar2) {
      testing::Message::Message(&local_1cd8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1cc8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1ce0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0xa8,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1ce0,&local_1cd8);
      testing::internal::AssertHelper::~AssertHelper(&local_1ce0);
      testing::Message::~Message(&local_1cd8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1cc8);
    if (bVar2) {
      event_base_free((event_base *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
    }
    DtlsSession::~DtlsSession((DtlsSession *)local_1c28);
    std::shared_ptr<ot::commissioner::UdpSocket>::~shared_ptr
              ((shared_ptr<ot::commissioner::UdpSocket> *)&gtest_ar_3.message_);
    DtlsSession::~DtlsSession((DtlsSession *)local_e30);
    std::shared_ptr<ot::commissioner::UdpSocket>::~shared_ptr
              ((shared_ptr<ot::commissioner::UdpSocket> *)&gtest_ar_1.message_);
  }
  DtlsConfig::~DtlsConfig((DtlsConfig *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

TEST(DtlsTest, MbedtlsClientServer)
{
    const ByteArray kHello{'h', 'e', 'l', 'l', 'o'};

    DtlsConfig config;

    // Setup dtls server
    config.mCaChain = ByteArray{kServerTrustAnchor.begin(), kServerTrustAnchor.end()};
    config.mOwnCert = ByteArray{kServerCert.begin(), kServerCert.end()};
    config.mOwnKey  = ByteArray{kServerKey.begin(), kServerKey.end()};

    config.mCaChain.push_back(0);
    config.mOwnCert.push_back(0);
    config.mOwnKey.push_back(0);

    auto eventBase = event_base_new();
    ASSERT_NE(eventBase, nullptr);

    auto serverSocket = std::make_shared<UdpSocket>(eventBase);
    EXPECT_EQ(serverSocket->Bind(kServerAddr, kServerPort), 0);

    DtlsSession dtlsServer{eventBase, true, serverSocket};
    EXPECT_EQ(dtlsServer.Init(config), ErrorCode::kNone);

    dtlsServer.SetReceiver([&kHello, eventBase](Endpoint &, const ByteArray &aBuf) {
        EXPECT_EQ(aBuf, kHello);

        event_base_loopbreak(eventBase);
    });

    auto serverConnected = [](const DtlsSession &aSession, Error aError) {
        EXPECT_EQ(aError, ErrorCode::kNone);
        EXPECT_EQ(aSession.GetState(), DtlsSession::State::kConnected);
    };
    dtlsServer.Connect(serverConnected);

    // Setup dtls client
    config.mCaChain = ByteArray{kClientTrustAnchor.begin(), kClientTrustAnchor.end()};
    config.mOwnCert = ByteArray{kClientCert.begin(), kClientCert.end()};
    config.mOwnKey  = ByteArray{kClientKey.begin(), kClientKey.end()};

    config.mCaChain.push_back(0);
    config.mOwnCert.push_back(0);
    config.mOwnKey.push_back(0);

    auto clientSocket = std::make_shared<UdpSocket>(eventBase);
    EXPECT_EQ(clientSocket->Connect(kServerAddr, kServerPort), 0);

    DtlsSession dtlsClient{eventBase, false, clientSocket};
    EXPECT_EQ(dtlsClient.Init(config), ErrorCode::kNone);

    auto clientConnected = [&kHello](DtlsSession &aSession, Error aError) {
        EXPECT_EQ(aError, ErrorCode::kNone);
        EXPECT_EQ(aSession.GetState(), DtlsSession::State::kConnected);
        EXPECT_EQ(aSession.Send(kHello, MessageSubType::kNone), ErrorCode::kNone);
    };
    dtlsClient.Connect(clientConnected);

    int fail = event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY);
    ASSERT_EQ(fail, 0);
    event_base_free(eventBase);
}